

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O0

int __thiscall ncnn::Yolov1Detection::load_param(Yolov1Detection *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,7);
  *(int *)(in_RDI + 0x80) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0x14);
  *(int *)(in_RDI + 0x84) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,5);
  *(int *)(in_RDI + 0x88) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,1);
  *(int *)(in_RDI + 0x8c) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,1);
  *(int *)(in_RDI + 0x90) = iVar1;
  fVar2 = ParamDict::get(in_RSI,5,0.25);
  *(float *)(in_RDI + 0x94) = fVar2;
  fVar2 = ParamDict::get(in_RSI,6,0.45);
  *(float *)(in_RDI + 0x98) = fVar2;
  return 0;
}

Assistant:

int Yolov1Detection::load_param(const ParamDict &pd)
{
    side = pd.get(0, 7);
    classes = pd.get(1, 20);
    box_num = pd.get(2, 5);
    sqrt_enable = pd.get(3, 1);
    softmax_enable = pd.get(4, 1);
    confidence_threshold = pd.get(5, 0.25f);
    nms_threshold = pd.get(6, 0.45f);

    return 0;
}